

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.hpp
# Opt level: O2

SquareMatrix<std::complex<float>_> __thiscall
qclab::dense::kron<std::complex<float>>
          (dense *this,SquareMatrix<std::complex<float>_> *A,SquareMatrix<std::complex<float>_> *B)

{
  data_type extraout_RDX;
  SquareMatrix<std::complex<float>_> SVar1;
  
  SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)this,B->size_ * A->size_);
  kron<qclab::dense::SquareMatrix<std::complex<float>>>
            (A,B,(SquareMatrix<std::complex<float>_> *)this);
  SVar1.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar1.size_ = (size_type_conflict)this;
  return SVar1;
}

Assistant:

SquareMatrix< T > kron( const SquareMatrix< T >& A ,
                            const SquareMatrix< T >& B ) {
      SquareMatrix< T > kronAB( A.rows() * B.rows() ) ;
      kron( A , B , kronAB ) ;
      return kronAB ;
    }